

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

bool absl::lts_20240722::container_internal::operator==(iterator *a,iterator *b)

{
  slot_type *psVar1;
  slot_type *psVar2;
  slot_type *psVar3;
  code *pcVar4;
  slot_type *psVar5;
  slot_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  tuple<> tStack_31;
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  tStack_30;
  
  psVar1 = (slot_type *)a->ctrl_;
  if ((psVar1 == (slot_type *)
                 absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> ||
       psVar1 == (slot_type *)0x0) || (-1 < (char)*(code *)psVar1)) {
    psVar2 = (slot_type *)b->ctrl_;
    if ((psVar2 != (slot_type *)
                   absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
         psVar2 != (slot_type *)0x0) && ((char)*(code *)psVar2 < '\0')) goto LAB_002af3d2;
    if (psVar1 == (slot_type *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
        psVar2 == (slot_type *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
LAB_002af3bb:
      return psVar1 == psVar2;
    }
    if ((psVar1 ==
        (slot_type *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) ==
        (psVar2 ==
        (slot_type *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>)) {
      if (psVar1 == (slot_type *)0x0 || psVar2 == (slot_type *)0x0) goto LAB_002af3bb;
      if ((psVar2 == (slot_type *)&kSooControl) == (psVar1 == (slot_type *)&kSooControl)) {
        a = (iterator *)(a->field_1).slot_;
        psVar3 = (b->field_1).slot_;
        if (psVar1 == (slot_type *)&kSooControl) {
          if ((slot_type *)a == psVar3) goto LAB_002af3bb;
        }
        else {
          psVar6 = psVar3;
          psVar5 = psVar2;
          b = (iterator *)(slot_type *)a;
          if (psVar2 < psVar1) {
            psVar6 = (slot_type *)a;
            psVar5 = psVar1;
            b = (iterator *)psVar3;
          }
          if ((psVar5 < b) && (b <= psVar6)) goto LAB_002af3bb;
        }
      }
      operator==();
      goto LAB_002af3cd;
    }
  }
  else {
LAB_002af3cd:
    operator==();
LAB_002af3d2:
    operator==();
  }
  operator==();
  pcVar4 = *(code **)a;
  if (pcVar4 == (code *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
    ::iterator::operator*((iterator *)a);
  }
  else if (pcVar4 != absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
    if (-1 < (char)*pcVar4) {
      return SUB81(*(anon_union_8_1_a8a14541_for_iterator_2 *)
                    &((remove_const_t<std::__cxx11::basic_string<char>_> *)a)->_M_string_length,0);
    }
    goto LAB_002af40a;
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
  ::iterator::operator*((iterator *)a);
LAB_002af40a:
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
  ::iterator::operator*((iterator *)a);
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
  ::AssertHashEqConsistent<std::__cxx11::string>
            ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
              *)b,key);
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
  ::find_or_prepare_insert_non_soo<std::__cxx11::string>
            ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>::iterator,_bool>
              *)a,(raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
                   *)b,key);
  if ((((value_type *)a)->first).field_2._M_local_buf[0] == '\x01') {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
    ::
    emplace_at<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<>>
              ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
                *)b,*a,(piecewise_construct_t *)&std::piecewise_construct,&tStack_30,&tStack_31);
  }
  return SUB81(a,0);
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }